

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O2

void Ses_ManPrintFuncs(Ses_Man_t *pSes)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  
  printf("find optimum circuit for %d %d-variable functions:\n",(ulong)(uint)pSes->nSpecFunc,
         (ulong)(uint)pSes->nSpecVars);
  iVar1 = 0;
  uVar2 = 0;
  while ((long)uVar2 < (long)pSes->nSpecFunc) {
    uVar2 = uVar2 + 1;
    printf("  func %d: ",uVar2 & 0xffffffff);
    Abc_TtPrintHexRev(_stdout,pSes->pSpec + iVar1,pSes->nSpecVars);
    putchar(10);
    iVar1 = iVar1 + 4;
  }
  if (pSes->nMaxDepth != -1) {
    printf("  max depth = %d\n");
    if (pSes->pArrTimeProfile != (int *)0x0) {
      printf("  arrival times =");
      for (lVar3 = 0; lVar3 < pSes->nSpecVars; lVar3 = lVar3 + 1) {
        printf(" %d",(ulong)(uint)pSes->pArrTimeProfile[lVar3]);
      }
      putchar(10);
      return;
    }
  }
  return;
}

Assistant:

static inline void Ses_ManPrintFuncs( Ses_Man_t * pSes )
{
    int h;

    printf( "find optimum circuit for %d %d-variable functions:\n", pSes->nSpecFunc, pSes->nSpecVars );
    for ( h = 0; h < pSes->nSpecFunc; ++h )
    {
        printf( "  func %d: ", h + 1 );
        Abc_TtPrintHexRev( stdout, &pSes->pSpec[h << 2], pSes->nSpecVars );
        printf( "\n" );
    }

    if ( pSes->nMaxDepth != -1 )
    {
        printf( "  max depth = %d\n", pSes->nMaxDepth );
        if ( pSes->pArrTimeProfile )
        {
            printf( "  arrival times =" );
            for ( h = 0; h < pSes->nSpecVars; ++h )
                printf( " %d", pSes->pArrTimeProfile[h] );
            printf( "\n" );
        }
    }
}